

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

void __thiscall
duckdb::MutableLogger::MutableLogger
          (MutableLogger *this,LogConfig *config_p,RegisteredLoggingContext context_p,
          LogManager *manager)

{
  pointer pcVar1;
  size_t sVar2;
  LogMode LVar3;
  undefined4 uVar4;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  local_38;
  
  (this->super_Logger).manager = manager;
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__MutableLogger_02445898;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  LVar3 = config_p->mode;
  (this->config).enabled = config_p->enabled;
  (this->config).mode = LVar3;
  (this->config).level = config_p->level;
  (this->config).storage._M_dataplus._M_p = (pointer)&(this->config).storage.field_2;
  pcVar1 = (config_p->storage)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->config).storage,pcVar1,pcVar1 + (config_p->storage)._M_string_length)
  ;
  local_38._M_h = (__hashtable_alloc *)&(this->config).enabled_log_types;
  (this->config).enabled_log_types._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->config).enabled_log_types._M_h._M_bucket_count =
       (config_p->enabled_log_types)._M_h._M_bucket_count;
  (this->config).enabled_log_types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->config).enabled_log_types._M_h._M_element_count =
       (config_p->enabled_log_types)._M_h._M_element_count;
  uVar4 = *(undefined4 *)&(config_p->enabled_log_types)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (config_p->enabled_log_types)._M_h._M_rehash_policy._M_next_resize;
  (this->config).enabled_log_types._M_h._M_rehash_policy._M_max_load_factor =
       (config_p->enabled_log_types)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->config).enabled_log_types._M_h._M_rehash_policy.field_0x4 = uVar4;
  (this->config).enabled_log_types._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->config).enabled_log_types._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_38._M_h,&(config_p->enabled_log_types)._M_h,&local_38);
  local_38._M_h = (__hashtable_alloc *)&(this->config).disabled_log_types;
  (this->config).disabled_log_types._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->config).disabled_log_types._M_h._M_bucket_count =
       (config_p->disabled_log_types)._M_h._M_bucket_count;
  (this->config).disabled_log_types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->config).disabled_log_types._M_h._M_element_count =
       (config_p->disabled_log_types)._M_h._M_element_count;
  uVar4 = *(undefined4 *)&(config_p->disabled_log_types)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (config_p->disabled_log_types)._M_h._M_rehash_policy._M_next_resize;
  (this->config).disabled_log_types._M_h._M_rehash_policy._M_max_load_factor =
       (config_p->disabled_log_types)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->config).disabled_log_types._M_h._M_rehash_policy.field_0x4 = uVar4;
  (this->config).disabled_log_types._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->config).disabled_log_types._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_38._M_h,&(config_p->disabled_log_types)._M_h,&local_38);
  (this->context).context.transaction_id.index = context_p.context.transaction_id.index;
  (this->context).context.query_id.index = context_p.context.query_id.index;
  (this->context).context.thread_id.index = context_p.context.thread_id.index;
  (this->context).context.connection_id.index = context_p.context.connection_id.index;
  (this->context).context_id = context_p.context_id;
  (this->context).context.scope = context_p.context.scope;
  *(undefined7 *)&(this->context).context.field_0x1 = context_p.context._1_7_;
  LOCK();
  (this->enabled)._M_base._M_i = (this->config).enabled;
  UNLOCK();
  LOCK();
  (this->level)._M_i = (this->config).level;
  UNLOCK();
  LOCK();
  (this->mode)._M_i = (this->config).mode;
  UNLOCK();
  return;
}

Assistant:

MutableLogger::MutableLogger(LogConfig &config_p, RegisteredLoggingContext context_p, LogManager &manager)
    : Logger(manager), config(config_p), context(context_p) {
	enabled = config.enabled;
	level = config.level;
	mode = config.mode;
}